

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datefmt.cpp
# Opt level: O3

UDate __thiscall icu_63::DateFormat::parse(DateFormat *this,UnicodeString *text,UErrorCode *status)

{
  UDate UVar1;
  ParsePosition pos;
  ParsePosition local_18;
  
  UVar1 = 0.0;
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    local_18.super_UObject._vptr_UObject = (_func_int **)&PTR__ParsePosition_0047d000;
    local_18.index = 0;
    local_18.errorIndex = -1;
    UVar1 = parse(this,text,&local_18);
    if (local_18.index == 0) {
      *status = U_ILLEGAL_ARGUMENT_ERROR;
    }
    ParsePosition::~ParsePosition(&local_18);
  }
  return UVar1;
}

Assistant:

UDate
DateFormat::parse(const UnicodeString& text,
                  UErrorCode& status) const
{
    if (U_FAILURE(status)) return 0;

    ParsePosition pos(0);
    UDate result = parse(text, pos);
    if (pos.getIndex() == 0) {
#if defined (U_DEBUG_CAL)
      fprintf(stderr, "%s:%d - - failed to parse  - err index %d\n"
              , __FILE__, __LINE__, pos.getErrorIndex() );
#endif
      status = U_ILLEGAL_ARGUMENT_ERROR;
    }
    return result;
}